

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O2

void memRev(void *buf,size_t count)

{
  byte *pbVar1;
  ulong uVar2;
  byte bVar3;
  byte *pbVar4;
  
  pbVar4 = (byte *)((count - (count >> 1)) + (long)buf);
  uVar2 = count >> 1;
  while (uVar2 != 0) {
    bVar3 = *(byte *)((long)buf + (uVar2 - 1)) ^ *pbVar4;
    *(byte *)((long)buf + (uVar2 - 1)) = bVar3;
    bVar3 = bVar3 ^ *pbVar4;
    *pbVar4 = bVar3;
    pbVar1 = (byte *)((long)buf + (uVar2 - 1));
    *pbVar1 = *pbVar1 ^ bVar3;
    pbVar4 = pbVar4 + 1;
    uVar2 = uVar2 - 1;
  }
  return;
}

Assistant:

void memRev(void* buf, size_t count)
{
	register size_t i = count / 2;
	ASSERT(memIsValid(buf, count));
	while (i--)
	{
		((octet*)buf)[i] ^= ((octet*)buf)[count - 1 - i];
		((octet*)buf)[count - 1 - i] ^= ((octet*)buf)[i];
		((octet*)buf)[i] ^= ((octet*)buf)[count - 1 - i];
	}
}